

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

int Train(void *hPtr,char *input,char *output,TrainingArgs trainArgs,AutotuneArgs autotuneArgs,
         TrainProgressCallback trainCallback,AutotuneProgressCallback autotuneCallback,char *label,
         char *pretrainedVectors,bool debug)

{
  TrainingArgs args_00;
  AutotuneArgs autotuneArgs_00;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  int64_t iVar4;
  ostream *poVar5;
  void *pvVar6;
  char *in_RDX;
  char *in_RSI;
  char *in_R9;
  double in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  int in_stack_00000030;
  int in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  double in_stack_00000048;
  int in_stack_00000050;
  byte in_stack_00000054;
  int in_stack_00000055;
  byte in_stack_00000059;
  byte in_stack_0000005a;
  byte in_stack_0000005b;
  ulong in_stack_0000005c;
  ulong in_stack_00000064;
  char *in_stack_00000070;
  char *in_stack_00000078;
  int in_stack_00000080;
  int in_stack_00000084;
  Args *in_stack_00000088;
  int in_stack_00000090;
  char *in_stack_00000098;
  byte in_stack_000000a0;
  exception *e;
  Autotune autotune;
  ofstream stream;
  string vectorsPath;
  string modelPath;
  string outPath;
  Args args;
  FastTextWrapper *fastText;
  Args *this;
  FastText *fastText_00;
  Autotune *this_00;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 caseInsensitive;
  char *in_stack_fffffffffffff410;
  undefined7 in_stack_fffffffffffff418;
  undefined1 in_stack_fffffffffffff41f;
  undefined8 in_stack_fffffffffffff430;
  undefined8 in_stack_fffffffffffff438;
  undefined8 in_stack_fffffffffffff440;
  undefined8 in_stack_fffffffffffff448;
  undefined8 in_stack_fffffffffffff450;
  undefined8 in_stack_fffffffffffff458;
  undefined8 in_stack_fffffffffffff460;
  undefined8 in_stack_fffffffffffff468;
  undefined8 in_stack_fffffffffffff470;
  undefined8 in_stack_fffffffffffff478;
  undefined8 in_stack_fffffffffffff480;
  undefined8 in_stack_fffffffffffff488;
  undefined4 in_stack_fffffffffffff490;
  undefined8 in_stack_fffffffffffff498;
  undefined8 in_stack_fffffffffffff4a0;
  undefined8 in_stack_fffffffffffff4a8;
  undefined8 in_stack_fffffffffffff4b0;
  int in_stack_fffffffffffff4b8;
  Args *in_stack_fffffffffffff4d8;
  string *in_stack_fffffffffffff5a8;
  FastText *in_stack_fffffffffffff5b0;
  string *in_stack_fffffffffffff628;
  FastText *in_stack_fffffffffffff630;
  TrainCallback *in_stack_fffffffffffff650;
  Args *in_stack_fffffffffffff658;
  FastText *in_stack_fffffffffffff660;
  char *local_970;
  char *local_958;
  char *local_8d0;
  char *local_8a8;
  char *local_790;
  char *local_778;
  bool local_732;
  bool local_721;
  ostream local_5e8 [512];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [24];
  AutotuneCallback *in_stack_fffffffffffffc70;
  Args *in_stack_fffffffffffffc78;
  Autotune *in_stack_fffffffffffffc80;
  string local_368 [37];
  byte local_343;
  byte local_342;
  allocator<char> local_341;
  string local_340 [37];
  byte local_31b;
  byte local_31a;
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [32];
  undefined4 local_2d0;
  allocator<char> local_2c9;
  string local_2c8 [55];
  allocator<char> local_291;
  string local_290 [32];
  undefined1 local_270 [15];
  undefined1 uStack_261;
  string *local_260;
  string *psStack_258;
  undefined1 local_248 [8];
  Args *pAStack_240;
  FastText *local_238;
  Autotune *pAStack_230;
  char *pcStack_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  allocator<char> *paStack_210;
  char *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_200;
  string local_1a8 [32];
  string local_188 [32];
  double local_168;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  double local_128;
  string local_120 [32];
  int local_100;
  string local_f8 [32];
  byte local_d8;
  int local_d4;
  byte local_d0;
  byte local_cf;
  byte local_ce;
  ulong local_c8;
  ulong local_c0;
  string local_b8 [32];
  string local_98 [32];
  int local_78;
  int local_74;
  string local_70 [32];
  int local_50;
  byte local_39;
  char *local_38;
  char *local_20;
  char *local_18;
  int local_4;
  
  local_39 = in_stack_000000a0 & 1;
  local_38 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memcpy(local_248,&stack0x00000008,100);
  memcpy(local_270,&stack0x00000070,0x24);
  args_00.lrUpdateRate = (int)in_stack_fffffffffffff438;
  args_00.dim = (int)((ulong)in_stack_fffffffffffff438 >> 0x20);
  args_00.lr = (double)in_stack_fffffffffffff430;
  args_00.ws = (int)in_stack_fffffffffffff440;
  args_00.epoch = (int)((ulong)in_stack_fffffffffffff440 >> 0x20);
  args_00.minCount = (int)in_stack_fffffffffffff448;
  args_00.minCountLabel = (int)((ulong)in_stack_fffffffffffff448 >> 0x20);
  args_00.neg = (int)in_stack_fffffffffffff450;
  args_00.wordNgrams = (int)((ulong)in_stack_fffffffffffff450 >> 0x20);
  args_00.loss = (int)in_stack_fffffffffffff458;
  args_00.model = (int)((ulong)in_stack_fffffffffffff458 >> 0x20);
  args_00.bucket = (int)in_stack_fffffffffffff460;
  args_00.minn = (int)((ulong)in_stack_fffffffffffff460 >> 0x20);
  args_00.maxn = (int)in_stack_fffffffffffff468;
  args_00.thread = (int)((ulong)in_stack_fffffffffffff468 >> 0x20);
  args_00.t = (double)in_stack_fffffffffffff470;
  args_00._72_8_ = in_stack_fffffffffffff478;
  args_00._80_8_ = in_stack_fffffffffffff480;
  args_00._88_8_ = in_stack_fffffffffffff488;
  args_00.dsub._4_4_ = in_stack_fffffffffffff490;
  autotuneArgs_00.metric = (char *)in_stack_fffffffffffff4a0;
  autotuneArgs_00.validationFile = (char *)in_stack_fffffffffffff498;
  autotuneArgs_00.predictions = (int)in_stack_fffffffffffff4a8;
  autotuneArgs_00.duration = (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20);
  autotuneArgs_00.modelSize = (char *)in_stack_fffffffffffff4b0;
  autotuneArgs_00.verbose = in_stack_fffffffffffff4b8;
  caseInsensitive = uStack_261;
  CreateArgs(args_00,autotuneArgs_00,
             (char *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
             in_stack_fffffffffffff410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbStack_200,local_208,paStack_210);
  std::__cxx11::string::operator=(local_1a8,local_290);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbStack_200,local_208,paStack_210);
  std::__cxx11::string::operator=(local_188,local_2c8);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&_lastError_abi_cxx11_,"Empty input file specified!");
    local_4 = -1;
    local_2d0 = 1;
    goto LAB_001f200f;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbStack_200,local_208,paStack_210);
  std::allocator<char>::~allocator(&local_2f1);
  uVar2 = std::__cxx11::string::empty();
  local_31a = 0;
  local_31b = 0;
  local_342 = 0;
  local_343 = 0;
  local_721 = false;
  this = pAStack_240;
  fastText_00 = local_238;
  this_00 = pAStack_230;
  __rhs = pcStack_220;
  __lhs = local_218;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    local_31a = 1;
    std::__cxx11::string::string<std::allocator<char>>(pbStack_200,local_208,paStack_210);
    local_31b = 1;
    bVar1 = EndsWith(psStack_258,local_260,(bool)caseInsensitive);
    local_732 = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_342 = 1;
      std::__cxx11::string::string<std::allocator<char>>(pbStack_200,local_208,paStack_210);
      local_343 = 1;
      local_732 = EndsWith(psStack_258,local_260,(bool)caseInsensitive);
    }
    local_721 = local_732;
    this = pAStack_240;
    fastText_00 = local_238;
    this_00 = pAStack_230;
    __rhs = pcStack_220;
    __lhs = local_218;
  }
  if ((local_343 & 1) != 0) {
    std::__cxx11::string::~string(local_340);
  }
  if ((local_342 & 1) != 0) {
    std::allocator<char>::~allocator(&local_341);
  }
  if ((local_31b & 1) != 0) {
    std::__cxx11::string::~string(local_318);
  }
  if ((local_31a & 1) != 0) {
    std::allocator<char>::~allocator(&local_319);
  }
  if (local_721 != false) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_368,(ulong)local_2f0);
    std::__cxx11::string::operator=(local_2f0,local_368);
    std::__cxx11::string::~string(local_368);
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffc78);
  std::__cxx11::string::string(local_3a8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = fasttext::Args::hasAutotune((Args *)0x1f08e3);
    if (bVar1) {
      iVar4 = fasttext::Args::getAutotuneModelSize(in_stack_fffffffffffff4d8);
      if (((double)iVar4 == -1.0) && (!NAN((double)iVar4))) goto LAB_001f094f;
      std::operator+(__lhs,__rhs);
    }
    else {
LAB_001f094f:
      std::operator+(__lhs,__rhs);
    }
    std::__cxx11::string::operator=((string *)&stack0xfffffffffffffc78,local_3c8);
    std::__cxx11::string::~string(local_3c8);
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::operator=(local_3a8,local_3e8);
    std::__cxx11::string::~string(local_3e8);
  }
  if ((local_39 & 1) != 0) {
    std::ofstream::ofstream(local_5e8,"_train.txt",_S_out);
    poVar5 = std::operator<<(local_5e8,"= eargs");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if (local_18 == (char *)0x0) {
      local_778 = "";
    }
    else {
      local_778 = local_18;
    }
    poVar5 = std::operator<<(local_5e8,local_778);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if (local_20 == (char *)0x0) {
      local_790 = "";
    }
    else {
      local_790 = local_20;
    }
    poVar5 = std::operator<<(poVar5,local_790);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000008);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000010);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000014);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000018);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_0000001c);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000020);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000024);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000028);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_0000002c);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000030);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000034);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000038);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_0000003c);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000040);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000044);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000048);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    if (local_38 == (char *)0x0) {
      local_8a8 = "";
    }
    else {
      local_8a8 = local_38;
    }
    poVar5 = std::operator<<(poVar5,local_8a8);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000050);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    if (in_stack_00000098 == (char *)0x0) {
      local_8d0 = "";
    }
    else {
      local_8d0 = in_stack_00000098;
    }
    poVar5 = std::operator<<(poVar5,local_8d0);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,(bool)(in_stack_00000054 & 1));
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000055);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,(bool)(in_stack_00000059 & 1));
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,(bool)(in_stack_0000005a & 1));
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,(bool)(in_stack_0000005b & 1));
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_0000005c);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000064);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    if (in_stack_00000070 == (char *)0x0) {
      local_958 = "";
    }
    else {
      local_958 = in_stack_00000070;
    }
    poVar5 = std::operator<<(poVar5,local_958);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if (in_stack_00000078 == (char *)0x0) {
      local_970 = "";
    }
    else {
      local_970 = in_stack_00000078;
    }
    poVar5 = std::operator<<(poVar5,local_970);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000080);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000084);
    in_stack_fffffffffffff660 =
         (FastText *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffff658 = in_stack_00000088;
    if (in_stack_00000088 == (Args *)0x0) {
      in_stack_fffffffffffff658 = (Args *)0x1fa319;
    }
    in_stack_fffffffffffff650 =
         (TrainCallback *)
         std::operator<<((ostream *)in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658);
    pvVar6 = (void *)std::ostream::operator<<
                               (in_stack_fffffffffffff650,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,in_stack_00000090);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(local_5e8,"= args");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffff630 = (FastText *)std::operator<<(local_5e8,local_1a8);
    in_stack_fffffffffffff628 =
         (string *)
         std::ostream::operator<<(in_stack_fffffffffffff630,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)in_stack_fffffffffffff628,local_188);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_168);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_160);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_15c);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_158);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_154);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_150);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffff5b0 = (FastText *)std::ostream::operator<<(pvVar6,local_14c);
    in_stack_fffffffffffff5a8 =
         (string *)
         std::ostream::operator<<(in_stack_fffffffffffff5b0,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(in_stack_fffffffffffff5a8,local_148);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_144);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_140);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_13c);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_138);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_134);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_130);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_12c);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_128);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,local_120);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_100);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,local_f8);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,(bool)(local_d8 & 1));
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_d4);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,(bool)(local_d0 & 1));
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,(bool)(local_cf & 1));
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,(bool)(local_ce & 1));
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_c8);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_c0);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,local_b8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,local_98);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_78);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_74);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,local_70);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_50);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    std::ofstream::~ofstream(local_5e8);
  }
  bVar1 = fasttext::Args::hasAutotune((Args *)0x1f1ca5);
  if (bVar1) {
    fasttext::Autotune::Autotune(this_00,fastText_00);
    std::function<void(double,int,double,double)>::function<void(*&)(double,int,double,double),void>
              ((function<void_(double,_int,_double,_double)> *)this_00,
               (_func_void_double_int_double_double **)fastText_00);
    fasttext::Autotune::train
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::function<void_(double,_int,_double,_double)>::~function
              ((function<void_(double,_int,_double,_double)> *)0x1f1d1e);
    fasttext::Autotune::~Autotune((Autotune *)this);
  }
  else {
    std::function<void(float,float,double,double,long)>::
    function<void(*&)(float,float,double,double,long),void>
              ((function<void_(float,_float,_double,_double,_long)> *)this_00,
               (_func_void_float_float_double_double_long **)fastText_00);
    fasttext::FastText::train
              (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650);
    std::function<void_(float,_float,_double,_double,_long)>::~function
              ((function<void_(float,_float,_double,_double,_long)> *)0x1f1dd2);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    fasttext::FastText::saveModel(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    fasttext::FastText::saveVectors(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  }
  local_4 = 0;
  local_2d0 = 1;
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc78);
  std::__cxx11::string::~string(local_2f0);
  pAStack_240 = this;
LAB_001f200f:
  fasttext::Args::~Args(pAStack_240);
  return local_4;
}

Assistant:

Train(void* hPtr, const char* input, const char* output, TrainingArgs trainArgs, AutotuneArgs autotuneArgs,
        TrainProgressCallback trainCallback, AutotuneProgressCallback autotuneCallback,
        const char* label, const char* pretrainedVectors, bool debug)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto args = CreateArgs(trainArgs, autotuneArgs, label, pretrainedVectors);
    args.input = std::string(EMPTYIFNULL(input));
    args.output = std::string(EMPTYIFNULL(output));

    if (args.input.empty())
    {
        _lastError = "Empty input file specified!";
        return -1;
    }

    std::string outPath(EMPTYIFNULL(output));
    if (!outPath.empty() && (EndsWith(outPath, ".bin", true) || EndsWith(outPath, ".ftz", true))) {
        outPath = outPath.substr(0, outPath.length()-4);
    }

    std::string modelPath;
    std::string vectorsPath;

    if (!outPath.empty()) {
        modelPath = args.hasAutotune() && args.getAutotuneModelSize() != Args::kUnlimitedModelSize
                         ? outPath + ".ftz"
                         : outPath + ".bin";
        vectorsPath = outPath + ".vec";
    }

    if (debug)
    {
        ofstream stream("_train.txt");
        stream << "= eargs" << endl;

        stream << EMPTYIFNULL(input) << endl
            << EMPTYIFNULL(output) << endl
            << trainArgs.lr << endl
            << trainArgs.lrUpdateRate << endl
            << trainArgs.dim << endl
            << trainArgs.ws << endl
            << trainArgs.epoch << endl
            << trainArgs.minCount << endl
            << trainArgs.minCountLabel << endl
            << trainArgs.neg << endl
            << trainArgs.wordNgrams << endl
            << (int)trainArgs.loss << endl
            << (int)trainArgs.model << endl
            << trainArgs.bucket << endl
            << trainArgs.minn << endl
            << trainArgs.maxn << endl
            << trainArgs.thread << endl
            << trainArgs.t << endl
            << EMPTYIFNULL(label) << endl
            << trainArgs.verbose << endl
            << EMPTYIFNULL(pretrainedVectors) << endl
            << trainArgs.saveOutput << endl
            << trainArgs.seed << endl
            << trainArgs.qout << endl
            << trainArgs.retrain << endl
            << trainArgs.qnorm << endl
            << trainArgs.cutoff << endl
            << trainArgs.dsub << endl

            << EMPTYIFNULL(autotuneArgs.validationFile) << endl
            << EMPTYIFNULL(autotuneArgs.metric) << endl
            << autotuneArgs.predictions << endl
            << autotuneArgs.duration << endl
            << EMPTYIFNULL(autotuneArgs.modelSize) << endl
            << autotuneArgs.verbose << endl;

        stream << "= args" << endl;

        stream << args.input << endl
            << args.output << endl
            << args.lr << endl
            << args.lrUpdateRate << endl
            << args.dim << endl
            << args.ws << endl
            << args.epoch << endl
            << args.minCount << endl
            << args.minCountLabel << endl
            << args.neg << endl
            << args.wordNgrams << endl
            << (int)args.loss << endl
            << (int)args.model << endl
            << args.bucket << endl
            << args.minn << endl
            << args.maxn << endl
            << args.thread << endl
            << args.t << endl
            << args.label << endl
            << args.verbose << endl
            << args.pretrainedVectors << endl
            << args.saveOutput << endl
            << args.seed << endl
            << args.qout << endl
            << args.retrain << endl
            << args.qnorm << endl
            << args.cutoff << endl
            << args.dsub << endl
            << args.autotuneValidationFile << endl
            << args.autotuneMetric << endl
            << args.autotunePredictions << endl
            << args.autotuneDuration << endl
            << args.autotuneModelSize << endl
            << args.autotuneVerbose << endl;

        stream.close();
    }

    try {
        if (args.hasAutotune())
        {
            Autotune autotune(fastText);
            autotune.train(args, autotuneCallback);
        }
        else
            fastText->train(args, trainCallback);

        if (!modelPath.empty())
            fastText->saveModel(modelPath);

        if (!vectorsPath.empty())
            fastText->saveVectors(vectorsPath);

        return 0;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}